

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteringRegister.hpp
# Opt level: O1

shared_ptr<supermap::Filter<supermap::Key<1UL>_>_> __thiscall
supermap::
FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>::
getRegisteredItemsInfo
          (FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>
           *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<supermap::Filter<supermap::Key<1UL>_>_> sVar2;
  shared_ptr<supermap::Filter<supermap::Key<1UL>_>_> sVar3;
  
  (in_RDI->super_Cloneable<supermap::Filter<supermap::Key<1UL>_>_>)._vptr_Cloneable =
       (_func_int **)
       (this->filter_).
       super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->filter_).
           super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  in_RDI[1].super_Cloneable<supermap::Filter<supermap::Key<1UL>_>_>._vptr_Cloneable =
       (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar2.super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = in_RDI;
      return (shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>)
             sVar2.
             super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>)
         sVar3.super___shared_ptr<supermap::Filter<supermap::Key<1UL>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<FilterBase> getRegisteredItemsInfo() const noexcept override {
        return filter_;
    }